

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_accumulation.cc
# Opt level: O1

bool __thiscall sptk::MinMaxAccumulation::Run(MinMaxAccumulation *this,double data,Buffer *buffer)

{
  _Base_ptr p_Var1;
  iterator __position;
  iterator __position_00;
  bool bVar2;
  pair<double,_int> local_30;
  
  bVar2 = (bool)(buffer != (Buffer *)0x0 & this->is_valid_);
  if (bVar2 != true) {
    return bVar2;
  }
  local_30.second = buffer->position_;
  local_30.first = data;
  if ((buffer->minimum_)._M_t._M_impl.super__Rb_tree_header._M_node_count <
      (ulong)(long)this->num_best_) {
LAB_00105f90:
    std::
    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::greater<double>,std::allocator<std::pair<double_const,int>>>
    ::_M_emplace_equal<std::pair<double,int>const&>
              ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::greater<double>,std::allocator<std::pair<double_const,int>>>
                *)&buffer->minimum_,&local_30);
  }
  else {
    __position._M_node = (buffer->minimum_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (data < *(double *)(__position._M_node + 1)) {
      std::
      _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::greater<double>,std::allocator<std::pair<double_const,int>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::greater<double>,std::allocator<std::pair<double_const,int>>>
                          *)&buffer->minimum_,__position);
      goto LAB_00105f90;
    }
  }
  if ((ulong)(long)this->num_best_ <=
      (buffer->maximum_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __position_00._M_node = (buffer->maximum_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = __position_00._M_node + 1;
    if (data < *(double *)p_Var1 || data == *(double *)p_Var1) goto LAB_00105fd0;
    std::
    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
    ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                        *)&buffer->maximum_,__position_00);
  }
  std::
  _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
  ::_M_emplace_equal<std::pair<double,int>const&>
            ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
              *)&buffer->maximum_,&local_30);
LAB_00105fd0:
  buffer->position_ = buffer->position_ + 1;
  return true;
}

Assistant:

bool MinMaxAccumulation::Run(double data,
                             MinMaxAccumulation::Buffer* buffer) const {
  if (!is_valid_ || NULL == buffer) {
    return false;
  }

  const std::pair<double, int> new_pair(
      std::make_pair(data, buffer->position_));

  if (buffer->minimum_.size() < static_cast<std::size_t>(num_best_)) {
    buffer->minimum_.insert(new_pair);
  } else if (data < buffer->minimum_.begin()->first) {
    buffer->minimum_.erase(buffer->minimum_.begin());
    buffer->minimum_.insert(new_pair);
  }

  if (buffer->maximum_.size() < static_cast<std::size_t>(num_best_)) {
    buffer->maximum_.insert(new_pair);
  } else if (buffer->maximum_.begin()->first < data) {
    buffer->maximum_.erase(buffer->maximum_.begin());
    buffer->maximum_.insert(new_pair);
  }

  ++(buffer->position_);

  return true;
}